

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

flag floatx80_le(floatx80 a,floatx80 b)

{
  ushort uVar1;
  ushort uVar2;
  flag fVar3;
  flag fVar4;
  int32 iVar5;
  bits64 bVar6;
  bits64 b1;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  bool local_33;
  flag bSign;
  flag aSign;
  floatx80 b_local;
  floatx80 a_local;
  
  b1 = b.low;
  a_00.low = a.low;
  uVar2 = b.high;
  uVar1 = a.high;
  a_00._2_6_ = 0;
  a_00.high = uVar1;
  iVar5 = extractFloatx80Exp(a_00);
  if (((iVar5 == 0x7fff) &&
      (a_01._2_6_ = 0, a_01.high = uVar1, a_01.low = a_00.low, bVar6 = extractFloatx80Frac(a_01),
      (bVar6 & 0x7fffffffffffffff) != 0)) ||
     ((a_02._2_6_ = 0, a_02.high = uVar2, a_02.low = b1, iVar5 = extractFloatx80Exp(a_02),
      iVar5 == 0x7fff &&
      (a_03._2_6_ = 0, a_03.high = uVar2, a_03.low = b1, bVar6 = extractFloatx80Frac(a_03),
      (bVar6 & 0x7fffffffffffffff) != 0)))) {
    float_raise('\x01');
    a_local.low._7_1_ = '\0';
  }
  else {
    a_04._2_6_ = 0;
    a_04.high = uVar1;
    a_04.low = a_00.low;
    fVar3 = extractFloatx80Sign(a_04);
    a_05._2_6_ = 0;
    a_05.high = uVar2;
    a_05.low = b1;
    fVar4 = extractFloatx80Sign(a_05);
    if (fVar3 == fVar4) {
      if (fVar3 == '\0') {
        a_local.low._7_1_ = le128((ulong)uVar1,a_00.low,(ulong)uVar2,b1);
      }
      else {
        a_local.low._7_1_ = le128((ulong)uVar2,b1,(ulong)uVar1,a_00.low);
      }
    }
    else {
      local_33 = true;
      if (fVar3 == '\0') {
        local_33 = (((uVar1 | uVar2) & 0x7fff) == 0 && a_00.low == 0) && b1 == 0;
      }
      a_local.low._7_1_ = local_33;
    }
  }
  return a_local.low._7_1_;
}

Assistant:

flag floatx80_le( floatx80 a, floatx80 b )
{
	flag aSign, bSign;

	if (    (    ( extractFloatx80Exp( a ) == 0x7FFF )
				&& (bits64) ( extractFloatx80Frac( a )<<1 ) )
			|| (    ( extractFloatx80Exp( b ) == 0x7FFF )
				&& (bits64) ( extractFloatx80Frac( b )<<1 ) )
		) {
		float_raise( float_flag_invalid );
		return 0;
	}
	aSign = extractFloatx80Sign( a );
	bSign = extractFloatx80Sign( b );
	if ( aSign != bSign ) {
		return
				aSign
			|| (    ( ( (bits16) ( ( a.high | b.high )<<1 ) ) | a.low | b.low )
					== 0 );
	}
	return
			aSign ? le128( b.high, b.low, a.high, a.low )
		: le128( a.high, a.low, b.high, b.low );

}